

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

void __thiscall
iDynTree::AttitudeQuaternionEKF::prepareMeasurementNoiseCovarianceMatrix
          (AttitudeQuaternionEKF *this,MatrixDynSize *R)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  
  sVar4 = iDynTree::MatrixDynSize::rows();
  if (sVar4 != this->m_output_size) {
    uVar5 = iDynTree::MatrixDynSize::cols();
    if (uVar5 != this->m_output_size) {
      iDynTree::MatrixDynSize::resize((ulong)R,this->m_output_size);
      iDynTree::MatrixDynSize::zero();
    }
  }
  lVar6 = iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar7 = iDynTree::MatrixDynSize::cols();
  dVar2 = (this->m_params_qekf).accelerometer_noise_variance;
  pdVar8 = (double *)(lVar6 + 0x10);
  lVar9 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar9);
    dVar3 = pdVar1[1];
    pdVar8[-2] = *pdVar1 * dVar2;
    pdVar8[-1] = dVar3 * dVar2;
    *pdVar8 = *(double *)((long)(this->m_Id3).m_data + lVar9 + 0x10) * dVar2;
    lVar9 = lVar9 + 0x18;
    pdVar8 = pdVar8 + lVar7;
  } while (lVar9 != 0x48);
  if ((this->m_params_qekf).use_magnetometer_measurements == true) {
    *(double *)(lVar6 + 0x18 + lVar7 * 0x18) = (this->m_params_qekf).magnetometer_noise_variance;
  }
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::prepareMeasurementNoiseCovarianceMatrix(iDynTree::MatrixDynSize& R)
{
    using iDynTree::toEigen;

    if (R.rows() != m_output_size && R.cols() != m_output_size)
    {
        R.resize(m_output_size, m_output_size);
        R.zero();
    }

    auto R_(toEigen(R));
    auto Id3(toEigen(m_Id3));

    R_.block<3, 3>(0, 0) = Id3*m_params_qekf.accelerometer_noise_variance;
    if (m_params_qekf.use_magnetometer_measurements)
    {
        R_(3, 3) = m_params_qekf.magnetometer_noise_variance;
    }
}